

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_font_atlas_init_default(nk_font_atlas *atlas)

{
  nk_font_atlas *__s;
  size_t __n;
  size_t __n_00;
  
  if (atlas != (nk_font_atlas *)0x0) {
    __n = (ulong)atlas & 3;
    if (__n == 0) {
      __n = 400;
      __s = atlas;
    }
    else {
      __n_00 = -__n + 4;
      memset(atlas,0,__n_00);
      memset((void *)((long)atlas + __n_00),0,0x18c);
      __s = (nk_font_atlas *)((long)atlas + -__n + 400);
    }
    memset(__s,0,__n);
    (atlas->temporary).userdata.ptr = (void *)0x0;
    (atlas->temporary).alloc = nk_malloc;
    (atlas->temporary).free = nk_mfree;
    (atlas->permanent).userdata.ptr = (void *)0x0;
    (atlas->permanent).alloc = nk_malloc;
    (atlas->permanent).free = nk_mfree;
    return;
  }
  __assert_fail("atlas",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x2f36,"void nk_font_atlas_init_default(struct nk_font_atlas *)");
}

Assistant:

NK_API void
nk_font_atlas_init_default(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    if (!atlas) return;
    nk_zero_struct(*atlas);
    atlas->temporary.userdata.ptr = 0;
    atlas->temporary.alloc = nk_malloc;
    atlas->temporary.free = nk_mfree;
    atlas->permanent.userdata.ptr = 0;
    atlas->permanent.alloc = nk_malloc;
    atlas->permanent.free = nk_mfree;
}